

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O0

TValue * lj_meta_tset(lua_State *L,cTValue *o,cTValue *k)

{
  uint uVar1;
  ulong uVar2;
  cTValue *mt;
  TValue *pTVar3;
  ulong uVar4;
  cTValue *in_RDX;
  cTValue *in_RSI;
  lua_State *in_RDI;
  cTValue *tv;
  GCtab *t;
  cTValue *mo;
  int loop;
  TValue tmp;
  GCobj *o_2;
  GCobj *o_1;
  cTValue *in_stack_ffffffffffffff48;
  ErrMsg em;
  cTValue *in_stack_ffffffffffffff50;
  cTValue *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int iVar5;
  cTValue in_stack_ffffffffffffff78;
  
  iVar5 = 0;
  do {
    if (99 < iVar5) {
      lj_err_msg((lua_State *)&in_stack_ffffffffffffff50->field_2,
                 (ErrMsg)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    }
    if ((in_RSI->field_2).it == 0xfffffff4) {
      uVar1 = ((GCRef *)&(in_RSI->u32).lo)->gcptr32;
      uVar2 = (ulong)uVar1;
      mt = lj_tab_get((lua_State *)&in_RSI->field_2,(GCtab *)&in_RDX->field_2,
                      (cTValue *)in_stack_ffffffffffffff78);
      if ((mt->field_2).it != 0xffffffff) {
        *(undefined1 *)(uVar2 + 6) = 0;
        if ((*(byte *)(uVar2 + 4) & 4) == 0) {
          return mt;
        }
        uVar4 = (ulong)(in_RDI->glref).ptr32;
        *(byte *)(uVar2 + 4) = *(byte *)(uVar2 + 4) & 0xfb;
        *(undefined4 *)(uVar2 + 0xc) = *(undefined4 *)(uVar4 + 0x6c);
        *(uint *)(uVar4 + 0x6c) = uVar1;
        return mt;
      }
      if (*(int *)(uVar2 + 0x10) == 0) {
        in_stack_ffffffffffffff50 = (cTValue *)0x0;
      }
      else if ((*(byte *)((ulong)*(uint *)(uVar2 + 0x10) + 6) & 2) == 0) {
        in_stack_ffffffffffffff48 =
             lj_meta_cache((GCtab *)&mt->field_2,(MMS)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                           (GCstr *)&in_stack_ffffffffffffff48->field_2);
        in_stack_ffffffffffffff50 = in_stack_ffffffffffffff48;
      }
      else {
        in_stack_ffffffffffffff48 = (cTValue *)0x0;
        in_stack_ffffffffffffff50 = in_stack_ffffffffffffff48;
      }
      in_stack_ffffffffffffff68 = in_stack_ffffffffffffff50;
      if (in_stack_ffffffffffffff50 == (cTValue *)0x0) {
        *(undefined1 *)(uVar2 + 6) = 0;
        if ((*(byte *)(uVar2 + 4) & 4) != 0) {
          uVar4 = (ulong)(in_RDI->glref).ptr32;
          *(byte *)(uVar2 + 4) = *(byte *)(uVar2 + 4) & 0xfb;
          *(undefined4 *)(uVar2 + 0xc) = *(undefined4 *)(uVar4 + 0x6c);
          *(uint *)(uVar4 + 0x6c) = uVar1;
        }
        if (mt != (cTValue *)((ulong)(in_RDI->glref).ptr32 + 0x130)) {
          return mt;
        }
        em = (ErrMsg)((ulong)in_stack_ffffffffffffff48 >> 0x20);
        if ((in_RDX->field_2).it == 0xffffffff) {
          lj_err_msg((lua_State *)0x0,em);
        }
        if (((in_RDX->field_2).it < 0xfffeffff) &&
           ((in_RDX->n != in_RDX->n || (NAN(in_RDX->n) || NAN(in_RDX->n))))) {
          lj_err_msg((lua_State *)0x0,em);
        }
        pTVar3 = lj_tab_newkey((lua_State *)&in_RSI->field_2,(GCtab *)&in_RDX->field_2,
                               (cTValue *)in_stack_ffffffffffffff78);
        return pTVar3;
      }
    }
    else {
      in_stack_ffffffffffffff68 =
           lj_meta_lookup((lua_State *)in_stack_ffffffffffffff78,
                          (cTValue *)CONCAT44(iVar5,in_stack_ffffffffffffff70),
                          (MMS)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      if ((in_stack_ffffffffffffff68->field_2).it == 0xffffffff) {
        lj_err_optype(in_RDI,in_RSI,(ErrMsg)((ulong)in_RDX >> 0x20));
      }
    }
    if ((in_stack_ffffffffffffff68->field_2).it == 0xfffffff7) {
      pTVar3 = mmcall(in_RDI,lj_cont_nop,in_stack_ffffffffffffff68,in_RSI,in_RDX);
      in_RDI->top = pTVar3;
      return (TValue *)0x0;
    }
    in_stack_ffffffffffffff78 = *in_stack_ffffffffffffff68;
    in_RSI = (cTValue *)&stack0xffffffffffffff78;
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

TValue *lj_meta_tset(lua_State *L, cTValue *o, cTValue *k)
{
  TValue tmp;
  int loop;
  for (loop = 0; loop < LJ_MAX_IDXCHAIN; loop++) {
    cTValue *mo;
    if (LJ_LIKELY(tvistab(o))) {
      GCtab *t = tabV(o);
      cTValue *tv = lj_tab_get(L, t, k);
      if (LJ_LIKELY(!tvisnil(tv))) {
	t->nomm = 0;  /* Invalidate negative metamethod cache. */
	lj_gc_anybarriert(L, t);
	return (TValue *)tv;
      } else if (!(mo = lj_meta_fast(L, tabref(t->metatable), MM_newindex))) {
	t->nomm = 0;  /* Invalidate negative metamethod cache. */
	lj_gc_anybarriert(L, t);
	if (tv != niltv(L))
	  return (TValue *)tv;
	if (tvisnil(k)) lj_err_msg(L, LJ_ERR_NILIDX);
	else if (tvisint(k)) { setnumV(&tmp, (lua_Number)intV(k)); k = &tmp; }
	else if (tvisnum(k) && tvisnan(k)) lj_err_msg(L, LJ_ERR_NANIDX);
	return lj_tab_newkey(L, t, k);
      }
    } else if (tvisnil(mo = lj_meta_lookup(L, o, MM_newindex))) {
      lj_err_optype(L, o, LJ_ERR_OPINDEX);
      return NULL;  /* unreachable */
    }
    if (tvisfunc(mo)) {
      L->top = mmcall(L, lj_cont_nop, mo, o, k);
      /* L->top+2 = v filled in by caller. */
      return NULL;  /* Trigger metamethod call. */
    }
    copyTV(L, &tmp, mo);
    o = &tmp;
  }
  lj_err_msg(L, LJ_ERR_SETLOOP);
  return NULL;  /* unreachable */
}